

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  
  pbVar2 = *p;
  uVar5 = (long)end - (long)pbVar2;
  if ((long)uVar5 < 1) {
    return -0x60;
  }
  if ((char)*pbVar2 < '\0') {
    switch(*pbVar2 & 0x7f) {
    case 1:
      if (uVar5 == 1) {
        return -0x60;
      }
      uVar5 = (ulong)pbVar2[1];
      *len = uVar5;
      pbVar4 = pbVar2 + 2;
      break;
    case 2:
      if (uVar5 < 3) {
        return -0x60;
      }
      uVar5 = (ulong)(ushort)(*(ushort *)(pbVar2 + 1) << 8 | *(ushort *)(pbVar2 + 1) >> 8);
      *len = uVar5;
      pbVar4 = pbVar2 + 3;
      break;
    case 3:
      if (uVar5 < 4) {
        return -0x60;
      }
      uVar5 = (ulong)pbVar2[3] | (ulong)((uint)pbVar2[2] << 8 | (uint)pbVar2[1] << 0x10);
      *len = uVar5;
      pbVar4 = pbVar2 + 4;
      break;
    case 4:
      if (uVar5 < 5) {
        return -0x60;
      }
      uVar1 = *(uint *)(pbVar2 + 1);
      uVar5 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
      *len = uVar5;
      pbVar4 = pbVar2 + 5;
      break;
    default:
      return -100;
    }
    *p = pbVar4;
  }
  else {
    pbVar4 = pbVar2 + 1;
    *p = pbVar4;
    uVar5 = (ulong)*pbVar2;
    *len = uVar5;
  }
  iVar3 = -0x60;
  if (uVar5 <= (ulong)((long)end - (long)pbVar4)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_len( unsigned char **p,
                  const unsigned char *end,
                  size_t *len )
{
    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( ( **p & 0x80 ) == 0 )
        *len = *(*p)++;
    else
    {
        switch( **p & 0x7F )
        {
        case 1:
            if( ( end - *p ) < 2 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = (*p)[1];
            (*p) += 2;
            break;

        case 2:
            if( ( end - *p ) < 3 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 8 ) | (*p)[2];
            (*p) += 3;
            break;

        case 3:
            if( ( end - *p ) < 4 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 16 ) |
                   ( (size_t)(*p)[2] << 8  ) | (*p)[3];
            (*p) += 4;
            break;

        case 4:
            if( ( end - *p ) < 5 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 24 ) | ( (size_t)(*p)[2] << 16 ) |
                   ( (size_t)(*p)[3] << 8  ) |           (*p)[4];
            (*p) += 5;
            break;

        default:
            return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
        }
    }

    if( *len > (size_t) ( end - *p ) )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    return( 0 );
}